

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O3

string * __thiscall
gl3cts::TextureSwizzle::SmokeTest::prepareArguments_abi_cxx11_
          (string *__return_storage_ptr__,SmokeTest *this,testCase *test_case)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  _func_int **pp_Var5;
  char *pcVar6;
  SmokeTest *pSVar7;
  size_t position;
  _func_int **local_a0;
  TestContext *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  sVar1 = test_case->m_source_texture_target_index;
  sVar2 = test_case->m_texture_access_index;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar6 = "COORDINATESLODDERIVATIVESOFFSETSSAMPLE";
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"COORDINATESLODDERIVATIVESOFFSETSSAMPLE","");
  prepareCoordinates_abi_cxx11_(&local_50,(SmokeTest *)pcVar6,test_case);
  pSVar7 = (SmokeTest *)&local_a0;
  local_a0 = (_func_int **)0x0;
  Utils::replaceToken("COORDINATES",(size_t *)pSVar7,local_50._M_dataplus._M_p,
                      __return_storage_ptr__);
  lVar3 = sVar2 * 0x18;
  lVar4 = sVar1 * 0x30;
  if ((texture_access[lVar3 + 0x12] == '\x01') && (texture_targets[lVar4 + 0x21] != '\0')) {
    pcVar6 = ", int(0)";
  }
  else {
    if (texture_access[lVar3 + 0x10] == '\x01') {
      local_98 = (TestContext *)&__return_storage_ptr__->field_2;
      prepareDerivatives_abi_cxx11_(&local_90,pSVar7,test_case,0);
      prepareDerivatives_abi_cxx11_(&local_70,pSVar7,test_case,1);
      pp_Var5 = local_a0;
      Utils::replaceToken("LODDERIVATIVES",(size_t *)&local_a0,", XXXXX, XXXXX",
                          __return_storage_ptr__);
      local_a0 = (_func_int **)((long)pp_Var5 + 2);
      Utils::replaceToken("XXXXX",(size_t *)&local_a0,local_90._M_dataplus._M_p,
                          __return_storage_ptr__);
      pSVar7 = (SmokeTest *)&local_a0;
      Utils::replaceToken("XXXXX",(size_t *)pSVar7,local_70._M_dataplus._M_p,__return_storage_ptr__)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        pSVar7 = (SmokeTest *)(local_70.field_2._M_allocated_capacity + 1);
        operator_delete(local_70._M_dataplus._M_p,(ulong)pSVar7);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        pSVar7 = (SmokeTest *)(local_90.field_2._M_allocated_capacity + 1);
        operator_delete(local_90._M_dataplus._M_p,(ulong)pSVar7);
      }
      goto LAB_00857ba0;
    }
    pcVar6 = "";
  }
  pSVar7 = (SmokeTest *)&local_a0;
  Utils::replaceToken("LODDERIVATIVES",(size_t *)pSVar7,pcVar6,__return_storage_ptr__);
LAB_00857ba0:
  if (texture_access[lVar3 + 0x13] == '\x01') {
    prepareOffsets_abi_cxx11_(&local_90,pSVar7,test_case);
    pp_Var5 = local_a0;
    Utils::replaceToken("OFFSETS",(size_t *)&local_a0,", XXXXX",__return_storage_ptr__);
    local_a0 = (_func_int **)((long)pp_Var5 + 2);
    Utils::replaceToken("XXXXX",(size_t *)&local_a0,local_90._M_dataplus._M_p,__return_storage_ptr__
                       );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    Utils::replaceToken("OFFSETS",(size_t *)&local_a0,"",__return_storage_ptr__);
  }
  if ((texture_targets[lVar4 + 0x24] == '\x01') && (texture_access[lVar3 + 0x14] == '\x01')) {
    prepareSample_abi_cxx11_(&local_90,this);
    pp_Var5 = local_a0;
    Utils::replaceToken("SAMPLE",(size_t *)&local_a0,", XX",__return_storage_ptr__);
    local_a0 = (_func_int **)((long)pp_Var5 + 2);
    Utils::replaceToken("XX",(size_t *)&local_a0,local_90._M_dataplus._M_p,__return_storage_ptr__);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    Utils::replaceToken("SAMPLE",(size_t *)&local_a0,"",__return_storage_ptr__);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SmokeTest::prepareArguments(const testCase& test_case)
{
	const _texture_access& access = texture_access[test_case.m_texture_access_index];
	const _texture_target& target = texture_targets[test_case.m_source_texture_target_index];

	std::string		   arguments   = "COORDINATESLODDERIVATIVESOFFSETSSAMPLE";
	const std::string& coordinates = prepareCoordinates(test_case);

	size_t position = 0;

	Utils::replaceToken("COORDINATES", position, coordinates.c_str(), arguments);

	if ((true == access.m_use_lod) && (true == target.m_support_lod))
	{
		Utils::replaceToken("LODDERIVATIVES", position, ", int(0)", arguments);
	}
	else if (true == access.m_use_derivaties)
	{
		const std::string& derivatives_0 = prepareDerivatives(test_case, 0);
		const std::string& derivatives_1 = prepareDerivatives(test_case, 1);
		const size_t	   start_pos	 = position;

		Utils::replaceToken("LODDERIVATIVES", position, ", XXXXX, XXXXX", arguments);
		position = start_pos + 2;
		Utils::replaceToken("XXXXX", position, derivatives_0.c_str(), arguments);
		Utils::replaceToken("XXXXX", position, derivatives_1.c_str(), arguments);
	}
	else
	{
		Utils::replaceToken("LODDERIVATIVES", position, "", arguments);
	}

	if (true == access.m_use_offsets)
	{
		const std::string& offsets   = prepareOffsets(test_case);
		const size_t	   start_pos = position;

		Utils::replaceToken("OFFSETS", position, ", XXXXX", arguments);
		position = start_pos + 2;
		Utils::replaceToken("XXXXX", position, offsets.c_str(), arguments);
	}
	else
	{
		Utils::replaceToken("OFFSETS", position, "", arguments);
	}

	if ((true == target.m_require_multisampling) && (true == access.m_support_multisampling))
	{
		const std::string& sample	= prepareSample();
		const size_t	   start_pos = position;

		Utils::replaceToken("SAMPLE", position, ", XX", arguments);
		position = start_pos + 2;
		Utils::replaceToken("XX", position, sample.c_str(), arguments);
	}
	else
	{
		Utils::replaceToken("SAMPLE", position, "", arguments);
	}

	return arguments;
}